

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Face.cpp
# Opt level: O1

void __thiscall Face::turn_face(Face *this,Direction dir)

{
  ulong uVar1;
  int i;
  long lVar2;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  Color color_tmp [16];
  
  color_tmp._40_8_ = *(undefined8 *)(this->color_data + 0xc);
  color_tmp._48_8_ = *(undefined8 *)(this->color_data + 0xe);
  color_tmp._24_8_ = *(undefined8 *)(this->color_data + 8);
  color_tmp._32_8_ = *(undefined8 *)(this->color_data + 10);
  color_tmp._8_8_ = *(undefined8 *)(this->color_data + 4);
  color_tmp._16_8_ = *(undefined8 *)(this->color_data + 6);
  uStack_48 = *(undefined8 *)this->color_data;
  color_tmp._0_8_ = *(undefined8 *)(this->color_data + 2);
  uVar1 = (ulong)(dir != clockwise);
  local_58 = *(undefined8 *)(this->ccw_rotation + uVar1 * 0x10 + -4);
  uStack_50 = *(undefined8 *)(this->ccw_rotation + uVar1 * 0x10 + -4 + 2);
  local_68 = *(undefined8 *)(this->cw_rotation + uVar1 * 0x10 + 8);
  uStack_60 = *(undefined8 *)(this->cw_rotation + uVar1 * 0x10 + 8 + 2);
  local_78 = *(undefined8 *)(this->cw_rotation + uVar1 * 0x10 + 4);
  uStack_70 = *(undefined8 *)(this->cw_rotation + uVar1 * 0x10 + 4 + 2);
  local_88 = *(undefined8 *)(this->cw_rotation + uVar1 * 0x10);
  uStack_80 = *(undefined8 *)(this->cw_rotation + uVar1 * 0x10 + 2);
  lVar2 = 0;
  do {
    this->color_data[lVar2] = color_tmp[(long)*(int *)((long)&local_88 + lVar2 * 4) + -2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  return;
}

Assistant:

void Face::turn_face(Direction dir){
    Color color_tmp[16];
    std::memcpy(color_tmp, color_data, 16*sizeof(Color));
    int turn_map[16];
    if(dir == Direction::clockwise){
        std::memcpy(turn_map, cw_rotation, 16*sizeof(int));
    }
    else{
        std::memcpy(turn_map, ccw_rotation, 16*sizeof(int));
    }
    for(int i = 0; i < 16; i++){
        color_data[i] = color_tmp[turn_map[i]];
    }
}